

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::rgbToHSV<float>
               (float *hue,float *sat,float *val,float red,float green,float blue,float maxval)

{
  float vmin;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = green;
  if (red <= green) {
    fVar1 = red;
  }
  fVar2 = blue;
  if (fVar1 <= blue) {
    fVar2 = fVar1;
  }
  fVar1 = green;
  if (green <= red) {
    fVar1 = red;
  }
  fVar3 = blue;
  if (blue <= fVar1) {
    fVar3 = fVar1;
  }
  *val = fVar3 / maxval;
  fVar2 = fVar3 - fVar2;
  fVar1 = 0.0;
  if (fVar2 <= 0.0) {
    *hue = 0.0;
  }
  else {
    if ((fVar3 != red) || (NAN(fVar3) || NAN(red))) {
      if ((fVar3 != green) || (NAN(fVar3) || NAN(green))) {
        fVar1 = (red - green) / fVar2 + 4.0;
      }
      else {
        fVar1 = (blue - red) / fVar2 + 2.0;
      }
    }
    else {
      fVar1 = (green - blue) / fVar2;
    }
    *hue = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 6.0) & -(uint)(fVar1 < 0.0))
    ;
    fVar1 = fVar2 / fVar3;
  }
  *sat = fVar1;
  return;
}

Assistant:

void rgbToHSV(float &hue, float &sat, float &val, T red, T green, T blue, T maxval)
{
  float delta, vmin, vmax;

  vmin=static_cast<float>(red);
  vmin=std::min(vmin, static_cast<float>(green));
  vmin=std::min(vmin, static_cast<float>(blue));

  vmax=static_cast<float>(red);
  vmax=std::max(vmax, static_cast<float>(green));
  vmax=std::max(vmax, static_cast<float>(blue));

  val=vmax/maxval;
  delta=vmax-vmin;

  if (delta > 0)
  {
    if (red == vmax)
    {
      hue=(green-blue)/delta;
    }
    else if (green == vmax)
    {
      hue=2+(blue-red)/delta;
    }
    else
    {
      hue=4+(red-green)/delta;
    }

    if (hue < 0)
    {
      hue+=6;
    }

    sat=delta/vmax;
  }
  else
  {
    hue=0;
    sat=0;
  }
}